

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

QuadLight *
embree::SceneGraph::QuadLight::lerp
          (QuadLight *__return_storage_ptr__,QuadLight *light0,QuadLight *light1,float f)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  
  fVar41 = 1.0 - f;
  fVar1 = (light1->v0).field_0.m128[0];
  fVar2 = (light1->v0).field_0.m128[1];
  fVar3 = (light1->v0).field_0.m128[2];
  fVar4 = (light1->v0).field_0.m128[3];
  fVar5 = (light0->v0).field_0.m128[0];
  fVar6 = (light0->v0).field_0.m128[1];
  fVar7 = (light0->v0).field_0.m128[2];
  fVar8 = (light0->v0).field_0.m128[3];
  fVar9 = (light1->v1).field_0.m128[0];
  fVar10 = (light1->v1).field_0.m128[1];
  fVar11 = (light1->v1).field_0.m128[2];
  fVar12 = (light1->v1).field_0.m128[3];
  fVar13 = (light0->v1).field_0.m128[0];
  fVar14 = (light0->v1).field_0.m128[1];
  fVar15 = (light0->v1).field_0.m128[2];
  fVar16 = (light0->v1).field_0.m128[3];
  fVar17 = (light1->v2).field_0.m128[0];
  fVar18 = (light1->v2).field_0.m128[1];
  fVar19 = (light1->v2).field_0.m128[2];
  fVar20 = (light1->v2).field_0.m128[3];
  fVar21 = (light0->v2).field_0.m128[0];
  fVar22 = (light0->v2).field_0.m128[1];
  fVar23 = (light0->v2).field_0.m128[2];
  fVar24 = (light0->v2).field_0.m128[3];
  fVar25 = (light1->v3).field_0.m128[0];
  fVar26 = (light1->v3).field_0.m128[1];
  fVar27 = (light1->v3).field_0.m128[2];
  fVar28 = (light1->v3).field_0.m128[3];
  fVar29 = (light0->v3).field_0.m128[0];
  fVar30 = (light0->v3).field_0.m128[1];
  fVar31 = (light0->v3).field_0.m128[2];
  fVar32 = (light0->v3).field_0.m128[3];
  fVar33 = (light1->L).field_0.m128[0];
  fVar34 = (light1->L).field_0.m128[1];
  fVar35 = (light1->L).field_0.m128[2];
  fVar36 = (light1->L).field_0.m128[3];
  fVar37 = (light0->L).field_0.m128[0];
  fVar38 = (light0->L).field_0.m128[1];
  fVar39 = (light0->L).field_0.m128[2];
  fVar40 = (light0->L).field_0.m128[3];
  (__return_storage_ptr__->super_Light).type = LIGHT_QUAD;
  (__return_storage_ptr__->v0).field_0.m128[0] = fVar5 * fVar41 + fVar1 * f;
  (__return_storage_ptr__->v0).field_0.m128[1] = fVar6 * fVar41 + fVar2 * f;
  (__return_storage_ptr__->v0).field_0.m128[2] = fVar7 * fVar41 + fVar3 * f;
  (__return_storage_ptr__->v0).field_0.m128[3] = fVar8 * fVar41 + fVar4 * f;
  (__return_storage_ptr__->v1).field_0.m128[0] = fVar13 * fVar41 + fVar9 * f;
  (__return_storage_ptr__->v1).field_0.m128[1] = fVar14 * fVar41 + fVar10 * f;
  (__return_storage_ptr__->v1).field_0.m128[2] = fVar15 * fVar41 + fVar11 * f;
  (__return_storage_ptr__->v1).field_0.m128[3] = fVar16 * fVar41 + fVar12 * f;
  (__return_storage_ptr__->v2).field_0.m128[0] = fVar21 * fVar41 + fVar17 * f;
  (__return_storage_ptr__->v2).field_0.m128[1] = fVar22 * fVar41 + fVar18 * f;
  (__return_storage_ptr__->v2).field_0.m128[2] = fVar23 * fVar41 + fVar19 * f;
  (__return_storage_ptr__->v2).field_0.m128[3] = fVar24 * fVar41 + fVar20 * f;
  (__return_storage_ptr__->v3).field_0.m128[0] = fVar29 * fVar41 + fVar25 * f;
  (__return_storage_ptr__->v3).field_0.m128[1] = fVar30 * fVar41 + fVar26 * f;
  (__return_storage_ptr__->v3).field_0.m128[2] = fVar31 * fVar41 + fVar27 * f;
  (__return_storage_ptr__->v3).field_0.m128[3] = fVar32 * fVar41 + fVar28 * f;
  (__return_storage_ptr__->L).field_0.m128[0] = fVar41 * fVar37 + f * fVar33;
  (__return_storage_ptr__->L).field_0.m128[1] = fVar41 * fVar38 + f * fVar34;
  (__return_storage_ptr__->L).field_0.m128[2] = fVar41 * fVar39 + f * fVar35;
  (__return_storage_ptr__->L).field_0.m128[3] = fVar41 * fVar40 + f * fVar36;
  return __return_storage_ptr__;
}

Assistant:

static QuadLight lerp(const QuadLight& light0, const QuadLight& light1, const float f)
      {
        return QuadLight(embree::lerp(light0.v0,light1.v0,f),
                         embree::lerp(light0.v1,light1.v1,f),
                         embree::lerp(light0.v2,light1.v2,f),
                         embree::lerp(light0.v3,light1.v3,f),
                         embree::lerp(light0.L,light1.L,f));
      }